

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

void luaH_newkey(lua_State *L,Table *t,TValue *key,TValue *value)

{
  Node *pNVar1;
  int *piVar2;
  lua_Number n;
  byte bVar3;
  Node *pNVar4;
  lu_byte lVar5;
  lu_byte lVar6;
  undefined2 uVar7;
  int i;
  int iVar8;
  int iVar9;
  Node *pNVar10;
  Node *pNVar11;
  Node *pNVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  char *fmt;
  uint uVar19;
  uint uVar20;
  int iVar21;
  Node *n_;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  TValue *io2;
  TValue *io_;
  lua_Integer k;
  lu_byte local_c0;
  TValue aux;
  
  if ((key->tt_ & 0xf) == 0) {
    fmt = "table index is nil";
LAB_00111835:
    luaG_runerror(L,fmt);
  }
  io_ = key;
  if (key->tt_ == 0x13) {
    n = (key->value_).n;
    iVar8 = luaV_flttointeger(n,&k,F2Ieq);
    if (iVar8 == 0) {
      if (NAN(n)) {
        fmt = "table index is NaN";
        goto LAB_00111835;
      }
    }
    else {
      io_ = &aux;
      aux.value_.i = k;
      aux.tt_ = '\x03';
    }
  }
  if ((value->tt_ & 0xf) == 0) {
    return;
  }
  pNVar10 = mainpositionTV(t,io_);
  pNVar4 = t->lastfree;
  if (((pNVar10->u).tt_ & 0xf) == 0) {
    if (pNVar4 == (Node *)0x0) goto LAB_0011161a;
  }
  else {
    if (pNVar4 == (Node *)0x0) {
LAB_0011161a:
      for (lVar16 = 0; lVar16 != 0x20; lVar16 = lVar16 + 1) {
        *(undefined4 *)((long)&k + lVar16 * 4) = 0;
      }
      setlimittosize(t);
      uVar24 = t->alimit;
      lVar16 = 0;
      uVar14 = 1;
      iVar8 = 0;
      uVar18 = 1;
      while ((lVar16 != 0x20 &&
             ((uVar19 = uVar14, uVar14 <= uVar24 || (uVar19 = uVar24, uVar18 <= uVar24))))) {
        uVar20 = uVar19 + 1;
        if (uVar19 + 1 < uVar18) {
          uVar20 = uVar18;
        }
        iVar21 = 0;
        for (uVar18 = uVar18 - 1; uVar18 - uVar20 != -1; uVar18 = uVar18 + 1) {
          iVar21 = (iVar21 + 1) - (uint)((t->array[uVar18].tt_ & 0xf) == 0);
        }
        piVar2 = (int *)((long)&k + lVar16 * 4);
        *piVar2 = *piVar2 + iVar21;
        iVar8 = iVar8 + iVar21;
        lVar16 = lVar16 + 1;
        uVar14 = uVar14 * 2;
        uVar18 = uVar20;
      }
      uVar22 = 1;
      lVar16 = (long)(1 << (t->lsizenode & 0x1f));
      iVar23 = 0;
      iVar21 = 0;
      do {
        lVar17 = -lVar16;
        lVar16 = lVar16 * 0x18 + 0x10;
        do {
          lVar13 = lVar16;
          lVar17 = lVar17 + 1;
          if (lVar17 == 1) {
            uVar24 = iVar23 + iVar8;
            if (io_->tt_ == '\x03') {
              iVar23 = countint((io_->value_).i,(uint *)&k);
              uVar24 = uVar24 + iVar23;
            }
            lVar16 = 0;
            uVar18 = 0;
            uVar14 = 0;
            uVar15 = 0;
            goto LAB_00111742;
          }
          pNVar4 = t->node;
          lVar16 = lVar13 + -0x18;
        } while ((*(byte *)((long)pNVar4 + lVar13 + -0x20) & 0xf) == 0);
        if (*(char *)((long)pNVar4 + lVar13 + -0x1f) == '\x03') {
          iVar9 = countint(*(lua_Integer *)((long)pNVar4 + lVar13 + -0x18),(uint *)&k);
          iVar23 = iVar23 + iVar9;
        }
        lVar16 = -lVar17;
        iVar21 = iVar21 + 1;
      } while( true );
    }
    lVar16 = 0;
    do {
      lVar17 = lVar16;
      if ((Node *)(lVar17 + (long)pNVar4) <= t->node) goto LAB_0011161a;
      t->lastfree = (Node *)((long)pNVar4 + lVar17 + -0x18);
      lVar16 = lVar17 + -0x18;
    } while (*(char *)((long)pNVar4 + lVar17 + -0xf) != '\0');
    k = (pNVar10->u).key_val.i;
    local_c0 = (pNVar10->u).key_tt;
    pNVar11 = mainpositionTV(t,(TValue *)&k);
    pNVar1 = (Node *)(lVar16 + (long)pNVar4);
    if (pNVar11 == pNVar10) {
      if ((long)(pNVar10->u).next != 0) {
        *(int *)((long)pNVar4 + lVar17 + -0xc) =
             (int)(((long)pNVar10 + (((long)(pNVar10->u).next * 0x18 - (long)pNVar4) - lVar16)) /
                  0x18);
      }
      (pNVar10->u).next = (int)(((long)pNVar4 + (lVar16 - (long)pNVar10)) / 0x18);
      pNVar10 = pNVar1;
    }
    else {
      do {
        pNVar12 = pNVar11;
        pNVar11 = pNVar12 + (pNVar12->u).next;
      } while (pNVar12 + (pNVar12->u).next != pNVar10);
      (pNVar12->u).next = (int)(((long)pNVar4 + (lVar16 - (long)pNVar12)) / 0x18);
      (pNVar1->u).key_val = (pNVar10->u).key_val;
      lVar5 = *(lu_byte *)((long)pNVar10 + 8);
      lVar6 = *(lu_byte *)((long)pNVar10 + 9);
      uVar7 = *(undefined2 *)((long)pNVar10 + 10);
      iVar8 = *(int *)((long)pNVar10 + 0xc);
      (pNVar1->u).value_ = (pNVar10->u).value_;
      *(lu_byte *)((long)pNVar1 + 8) = lVar5;
      *(lu_byte *)((long)pNVar1 + 9) = lVar6;
      *(undefined2 *)((long)pNVar1 + 10) = uVar7;
      *(int *)((long)pNVar1 + 0xc) = iVar8;
      if ((pNVar10->u).next != 0) {
        piVar2 = (int *)((long)pNVar4 + lVar17 + -0xc);
        *piVar2 = *piVar2 + (int)(((long)pNVar10 + (-lVar16 - (long)pNVar4)) / 0x18);
        (pNVar10->u).next = 0;
      }
      (pNVar10->u).tt_ = '\x10';
    }
  }
  (pNVar10->u).key_val = io_->value_;
  bVar3 = io_->tt_;
  (pNVar10->u).key_tt = bVar3;
  if ((((bVar3 & 0x40) != 0) && ((t->marked & 0x20) != 0)) &&
     ((((io_->value_).gc)->marked & 0x18) != 0)) {
    luaC_barrierback_(L,(GCObject *)t);
  }
  (pNVar10->u).value_ = value->value_;
  (pNVar10->u).tt_ = value->tt_;
  return;
LAB_00111742:
  if (lVar16 == 0x20) {
LAB_00111767:
    luaH_resize(L,t,(uint)uVar15,((iVar8 + iVar21) - uVar14) + 1);
    luaH_set(L,t,io_,value);
    return;
  }
  uVar19 = (uint)(uVar22 >> 1);
  if (uVar24 <= uVar19) goto LAB_00111767;
  uVar18 = uVar18 + *(int *)((long)&k + lVar16 * 4);
  if (uVar19 < uVar18) {
    uVar15 = uVar22;
    uVar14 = uVar18;
  }
  lVar16 = lVar16 + 1;
  uVar22 = (ulong)(uint)((int)uVar22 * 2);
  goto LAB_00111742;
}

Assistant:

static void luaH_newkey (lua_State *L, Table *t, const TValue *key,
                                                 TValue *value) {
  Node *mp;
  TValue aux;
  if (l_unlikely(ttisnil(key)))
    luaG_runerror(L, "table index is nil");
  else if (ttisfloat(key)) {
    lua_Number f = fltvalue(key);
    lua_Integer k;
    if (luaV_flttointeger(f, &k, F2Ieq)) {  /* does key fit in an integer? */
      setivalue(&aux, k);
      key = &aux;  /* insert it as an integer */
    }
    else if (l_unlikely(luai_numisnan(f)))
      luaG_runerror(L, "table index is NaN");
  }
  if (ttisnil(value))
    return;  /* do not insert nil values */
  mp = mainpositionTV(t, key);
  if (!isempty(gval(mp)) || isdummy(t)) {  /* main position is taken? */
    Node *othern;
    Node *f = getfreepos(t);  /* get a free place */
    if (f == NULL) {  /* cannot find a free place? */
      rehash(L, t, key);  /* grow table */
      /* whatever called 'newkey' takes care of TM cache */
      luaH_set(L, t, key, value);  /* insert key into grown table */
      return;
    }
    lua_assert(!isdummy(t));
    othern = mainpositionfromnode(t, mp);
    if (othern != mp) {  /* is colliding node out of its main position? */
      /* yes; move colliding node into free position */
      while (othern + gnext(othern) != mp)  /* find previous */
        othern += gnext(othern);
      gnext(othern) = cast_int(f - othern);  /* rechain to point to 'f' */
      *f = *mp;  /* copy colliding node into free pos. (mp->next also goes) */
      if (gnext(mp) != 0) {
        gnext(f) += cast_int(mp - f);  /* correct 'next' */
        gnext(mp) = 0;  /* now 'mp' is free */
      }
      setempty(gval(mp));
    }
    else {  /* colliding node is in its own main position */
      /* new node will go into free position */
      if (gnext(mp) != 0)
        gnext(f) = cast_int((mp + gnext(mp)) - f);  /* chain new position */
      else lua_assert(gnext(f) == 0);
      gnext(mp) = cast_int(f - mp);
      mp = f;
    }
  }
  setnodekey(L, mp, key);
  luaC_barrierback(L, obj2gco(t), key);
  lua_assert(isempty(gval(mp)));
  setobj2t(L, gval(mp), value);
}